

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

int cvui::printf(char *__format,...)

{
  char in_AL;
  int iVar1;
  uint in_ECX;
  int in_EDX;
  int in_ESI;
  char *in_R8;
  undefined8 in_R9;
  double in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_138 [40];
  undefined8 local_110;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  allocator<char> local_69;
  String local_68;
  undefined4 local_48;
  undefined4 local_44;
  va_list aArgs;
  char *theFmt_local;
  uint theColor_local;
  double theFontScale_local;
  int theY_local;
  int theX_local;
  Mat *theWhere_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  aArgs[0].overflow_arg_area = local_138;
  aArgs[0]._0_8_ = &stack0x00000008;
  local_44 = 0x40;
  local_48 = 0x28;
  local_110 = in_R9;
  aArgs[0].reg_save_area = in_R8;
  vsprintf(internal::gBuffer,in_R8,&local_48);
  cv::Mat::operator=((Mat *)internal::gScreen,(Mat *)__format);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,internal::gBuffer,&local_69);
  internal::text((cvui_block_t *)internal::gScreen,in_ESI,in_EDX,&local_68,in_XMM0_Qa,in_ECX,true);
  std::__cxx11::string::~string((string *)&local_68);
  iVar1 = std::allocator<char>::~allocator(&local_69);
  return iVar1;
}

Assistant:

void printf(cv::Mat& theWhere, int theX, int theY, double theFontScale, unsigned int theColor, const char *theFmt, ...) {
	va_list aArgs;

	va_start(aArgs, theFmt);
	vsprintf_s(internal::gBuffer, theFmt, aArgs);
	va_end(aArgs);

	internal::gScreen.where = theWhere;
	internal::text(internal::gScreen, theX, theY, internal::gBuffer, theFontScale, theColor, true);
}